

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::FrexpCase::compare(FrexpCase *this,void **inputs,void **outputs)

{
  float fVar1;
  Precision PVar2;
  pointer pSVar3;
  int iVar4;
  ostream *poVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  ostringstream *this_00;
  long lVar11;
  deUint32 u32;
  Hex<8UL> local_58;
  HexFloat local_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar2 = (pSVar3->varType).m_data.basic.precision;
  iVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  bVar6 = iVar4 < 1;
  if (0 < iVar4) {
    fVar10 = (float)~(-1 << (0x17 - (&DAT_00986d1c)[(ulong)PVar2 * 4] & 0x1f));
    lVar11 = 0;
    do {
      fVar1 = *(float *)((long)*inputs + lVar11 * 4);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        local_48 = (float)((uint)fVar1 & 0x807fffff | 0x3f000000);
        iVar8 = ((uint)fVar1 >> 0x17 & 0xff) - 0x7e;
        iVar7 = iVar8;
        if (((uint)fVar1 & 0x7fffff) != 0) {
          iVar7 = -0x7d;
        }
        if (((uint)fVar1 & 0x7f800000) != 0) {
          iVar7 = iVar8;
        }
      }
      else {
        local_48 = (float)((uint)fVar1 & 0x80000000);
        iVar7 = 0;
      }
      fVar1 = *(float *)((long)*outputs + lVar11 * 4);
      if (((fVar1 == 0.0) && (fVar9 = local_48, !NAN(fVar1))) ||
         ((local_48 == 0.0 && (fVar9 = fVar1, !NAN(local_48))))) {
        fVar9 = ABS(fVar9);
      }
      else {
        fVar9 = (float)((int)local_48 - (int)fVar1);
        if ((uint)local_48 < (uint)fVar1) {
          fVar9 = (float)-((int)local_48 - (int)fVar1);
        }
      }
      if (((uint)fVar10 < (uint)fVar9) || (*(int *)((long)outputs[1] + lVar11 * 4) != iVar7)) {
        this_00 = &(this->super_CommonFunctionCase).m_failMsg;
        uStack_44 = 0;
        uStack_40 = 0;
        uStack_3c = 0;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        poVar5 = (ostream *)std::ostream::operator<<(this_00,(int)lVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = ",4);
        local_4c.value = local_48;
        poVar5 = Functional::operator<<(poVar5,&local_4c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," with ULP threshold ",0x14);
        local_58.value = (deUint64)(uint)fVar10;
        poVar5 = tcu::Format::Hex<8UL>::toStream(&local_58,poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", got ULP diff ",0xf);
        local_58.value = (deUint64)(uint)fVar9;
        tcu::Format::Hex<8UL>::toStream(&local_58,poVar5);
        return bVar6;
      }
      lVar11 = lVar11 + 1;
      bVar6 = iVar4 <= (int)lVar11;
    } while (iVar4 != (int)lVar11);
  }
  return bVar6;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type						= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision					= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize					= glu::getDataTypeScalarSize(type);
		const bool				signedZero					= false;

		const int				mantissaBits				= getMinMantissaBits(precision);
		const deUint32			maxUlpDiff					= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const int		out1		= ((const int*)outputs[1])[compNdx];

			float			refOut0;
			int				refOut1;

			frexp(in0, &refOut0, &refOut1);

			const deUint32	ulpDiff0	= signedZero ? getUlpDiff(out0, refOut0) : getUlpDiffIgnoreZeroSign(out0, refOut0);

			if (ulpDiff0 > maxUlpDiff || out1 != refOut1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(refOut0) << ", " << refOut1 << " with ULP threshold "
						  << tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff0);
				return false;
			}
		}

		return true;
	}